

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

bool __thiscall
TCMallocImplementation::GetNumericProperty(TCMallocImplementation *this,char *name,size_t *value)

{
  bool bVar1;
  int iVar2;
  SpinLock *pSVar3;
  PageHeap *pPVar4;
  size_t sVar5;
  TestingPortal **ppTVar6;
  TestingPortal *pTVar7;
  TestingPortal **portal;
  SpinLockHolder h;
  SpinLockHolder l_13;
  SpinLockHolder l_12;
  TCMallocStats stats_7;
  SpinLockHolder l_11;
  size_t local_6d8;
  SpinLockHolder local_6d0;
  SpinLockHolder l_10;
  size_t local_680;
  SpinLockHolder local_670;
  SpinLockHolder l_9;
  size_t local_628;
  SpinLockHolder local_610;
  SpinLockHolder l_8;
  size_t local_5d0;
  SpinLockHolder local_5b0;
  SpinLockHolder l_7;
  size_t local_578;
  SpinLockHolder local_550;
  SpinLockHolder l_6;
  size_t local_520;
  SpinLockHolder local_4f0;
  SpinLockHolder l_5;
  size_t local_4c8;
  SpinLockHolder local_490;
  SpinLockHolder l_4;
  size_t local_470;
  SpinLockHolder local_430;
  SpinLockHolder l_3;
  size_t local_418;
  SpinLockHolder local_3d0;
  SpinLockHolder l_2;
  size_t local_3c0;
  SpinLockHolder local_370;
  SpinLockHolder l_1;
  TCMallocStats stats_6;
  TCMallocStats stats_5;
  TCMallocStats stats_4;
  undefined1 local_1f0 [8];
  Stats stats_3;
  SpinLockHolder l;
  TCMallocStats stats_2;
  TCMallocStats stats_1;
  TCMallocStats stats;
  size_t *value_local;
  char *name_local;
  TCMallocImplementation *this_local;
  
  iVar2 = strcmp(name,"generic.current_allocated_bytes");
  if (iVar2 == 0) {
    TCMallocStats::TCMallocStats((TCMallocStats *)&stats_1.pageheap.total_reserve_bytes);
    ExtractStats((TCMallocStats *)&stats_1.pageheap.total_reserve_bytes,(uint64_t *)0x0,
                 (SmallSpanStats *)0x0,(LargeSpanStats *)0x0);
    *value = ((((stats.metadata_bytes - stats_1.pageheap.total_reserve_bytes) - stats.thread_bytes)
              - stats.central_bytes) - stats.pageheap.system_bytes) - stats.pageheap.free_bytes;
    this_local._7_1_ = true;
  }
  else {
    iVar2 = strcmp(name,"generic.heap_size");
    if (iVar2 == 0) {
      TCMallocStats::TCMallocStats((TCMallocStats *)&stats_2.pageheap.total_reserve_bytes);
      ExtractStats((TCMallocStats *)&stats_2.pageheap.total_reserve_bytes,(uint64_t *)0x0,
                   (SmallSpanStats *)0x0,(LargeSpanStats *)0x0);
      *value = stats_1.metadata_bytes;
      this_local._7_1_ = true;
    }
    else {
      iVar2 = strcmp(name,"generic.total_physical_bytes");
      if (iVar2 == 0) {
        TCMallocStats::TCMallocStats((TCMallocStats *)&l);
        ExtractStats((TCMallocStats *)&l,(uint64_t *)0x0,(SmallSpanStats *)0x0,(LargeSpanStats *)0x0
                    );
        *value = (stats_2.metadata_bytes + stats_2.transfer_bytes) - stats_2.pageheap.free_bytes;
        this_local._7_1_ = true;
      }
      else {
        iVar2 = strcmp(name,"tcmalloc.slack_bytes");
        if (iVar2 == 0) {
          pSVar3 = tcmalloc::Static::pageheap_lock();
          SpinLockHolder::SpinLockHolder((SpinLockHolder *)&stats_3.total_reserve_bytes,pSVar3);
          pPVar4 = tcmalloc::Static::pageheap();
          tcmalloc::PageHeap::StatsLocked((Stats *)local_1f0,pPVar4);
          *value = stats_3.system_bytes + stats_3.free_bytes;
          this_local._7_1_ = true;
          SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&stats_3.total_reserve_bytes);
        }
        else {
          iVar2 = strcmp(name,"tcmalloc.central_cache_free_bytes");
          if (iVar2 == 0) {
            TCMallocStats::TCMallocStats((TCMallocStats *)&stats_5.pageheap.total_reserve_bytes);
            ExtractStats((TCMallocStats *)&stats_5.pageheap.total_reserve_bytes,(uint64_t *)0x0,
                         (SmallSpanStats *)0x0,(LargeSpanStats *)0x0);
            *value = stats_4.thread_bytes;
            this_local._7_1_ = true;
          }
          else {
            iVar2 = strcmp(name,"tcmalloc.transfer_cache_free_bytes");
            if (iVar2 == 0) {
              TCMallocStats::TCMallocStats((TCMallocStats *)&stats_6.pageheap.total_reserve_bytes);
              ExtractStats((TCMallocStats *)&stats_6.pageheap.total_reserve_bytes,(uint64_t *)0x0,
                           (SmallSpanStats *)0x0,(LargeSpanStats *)0x0);
              *value = stats_5.central_bytes;
              this_local._7_1_ = true;
            }
            else {
              iVar2 = strcmp(name,"tcmalloc.thread_cache_free_bytes");
              if (iVar2 == 0) {
                TCMallocStats::TCMallocStats((TCMallocStats *)&l_1);
                ExtractStats((TCMallocStats *)&l_1,(uint64_t *)0x0,(SmallSpanStats *)0x0,
                             (LargeSpanStats *)0x0);
                *value = (size_t)l_1.lock_;
                this_local._7_1_ = true;
              }
              else {
                iVar2 = strcmp(name,"tcmalloc.pageheap_free_bytes");
                if (iVar2 == 0) {
                  pSVar3 = tcmalloc::Static::pageheap_lock();
                  SpinLockHolder::SpinLockHolder(&local_370,pSVar3);
                  pPVar4 = tcmalloc::Static::pageheap();
                  tcmalloc::PageHeap::StatsLocked((Stats *)&l_2,pPVar4);
                  *value = local_3c0;
                  this_local._7_1_ = true;
                  SpinLockHolder::~SpinLockHolder(&local_370);
                }
                else {
                  iVar2 = strcmp(name,"tcmalloc.pageheap_unmapped_bytes");
                  if (iVar2 == 0) {
                    pSVar3 = tcmalloc::Static::pageheap_lock();
                    SpinLockHolder::SpinLockHolder(&local_3d0,pSVar3);
                    pPVar4 = tcmalloc::Static::pageheap();
                    tcmalloc::PageHeap::StatsLocked((Stats *)&l_3,pPVar4);
                    *value = local_418;
                    this_local._7_1_ = true;
                    SpinLockHolder::~SpinLockHolder(&local_3d0);
                  }
                  else {
                    iVar2 = strcmp(name,"tcmalloc.pageheap_committed_bytes");
                    if (iVar2 == 0) {
                      pSVar3 = tcmalloc::Static::pageheap_lock();
                      SpinLockHolder::SpinLockHolder(&local_430,pSVar3);
                      pPVar4 = tcmalloc::Static::pageheap();
                      tcmalloc::PageHeap::StatsLocked((Stats *)&l_4,pPVar4);
                      *value = local_470;
                      this_local._7_1_ = true;
                      SpinLockHolder::~SpinLockHolder(&local_430);
                    }
                    else {
                      iVar2 = strcmp(name,"tcmalloc.pageheap_scavenge_count");
                      if (iVar2 == 0) {
                        pSVar3 = tcmalloc::Static::pageheap_lock();
                        SpinLockHolder::SpinLockHolder(&local_490,pSVar3);
                        pPVar4 = tcmalloc::Static::pageheap();
                        tcmalloc::PageHeap::StatsLocked((Stats *)&l_5,pPVar4);
                        *value = local_4c8;
                        this_local._7_1_ = true;
                        SpinLockHolder::~SpinLockHolder(&local_490);
                      }
                      else {
                        iVar2 = strcmp(name,"tcmalloc.pageheap_commit_count");
                        if (iVar2 == 0) {
                          pSVar3 = tcmalloc::Static::pageheap_lock();
                          SpinLockHolder::SpinLockHolder(&local_4f0,pSVar3);
                          pPVar4 = tcmalloc::Static::pageheap();
                          tcmalloc::PageHeap::StatsLocked((Stats *)&l_6,pPVar4);
                          *value = local_520;
                          this_local._7_1_ = true;
                          SpinLockHolder::~SpinLockHolder(&local_4f0);
                        }
                        else {
                          iVar2 = strcmp(name,"tcmalloc.pageheap_total_commit_bytes");
                          if (iVar2 == 0) {
                            pSVar3 = tcmalloc::Static::pageheap_lock();
                            SpinLockHolder::SpinLockHolder(&local_550,pSVar3);
                            pPVar4 = tcmalloc::Static::pageheap();
                            tcmalloc::PageHeap::StatsLocked((Stats *)&l_7,pPVar4);
                            *value = local_578;
                            this_local._7_1_ = true;
                            SpinLockHolder::~SpinLockHolder(&local_550);
                          }
                          else {
                            iVar2 = strcmp(name,"tcmalloc.pageheap_decommit_count");
                            if (iVar2 == 0) {
                              pSVar3 = tcmalloc::Static::pageheap_lock();
                              SpinLockHolder::SpinLockHolder(&local_5b0,pSVar3);
                              pPVar4 = tcmalloc::Static::pageheap();
                              tcmalloc::PageHeap::StatsLocked((Stats *)&l_8,pPVar4);
                              *value = local_5d0;
                              this_local._7_1_ = true;
                              SpinLockHolder::~SpinLockHolder(&local_5b0);
                            }
                            else {
                              iVar2 = strcmp(name,"tcmalloc.pageheap_total_decommit_bytes");
                              if (iVar2 == 0) {
                                pSVar3 = tcmalloc::Static::pageheap_lock();
                                SpinLockHolder::SpinLockHolder(&local_610,pSVar3);
                                pPVar4 = tcmalloc::Static::pageheap();
                                tcmalloc::PageHeap::StatsLocked((Stats *)&l_9,pPVar4);
                                *value = local_628;
                                this_local._7_1_ = true;
                                SpinLockHolder::~SpinLockHolder(&local_610);
                              }
                              else {
                                iVar2 = strcmp(name,"tcmalloc.pageheap_reserve_count");
                                if (iVar2 == 0) {
                                  pSVar3 = tcmalloc::Static::pageheap_lock();
                                  SpinLockHolder::SpinLockHolder(&local_670,pSVar3);
                                  pPVar4 = tcmalloc::Static::pageheap();
                                  tcmalloc::PageHeap::StatsLocked((Stats *)&l_10,pPVar4);
                                  *value = local_680;
                                  this_local._7_1_ = true;
                                  SpinLockHolder::~SpinLockHolder(&local_670);
                                }
                                else {
                                  iVar2 = strcmp(name,"tcmalloc.pageheap_total_reserve_bytes");
                                  if (iVar2 == 0) {
                                    pSVar3 = tcmalloc::Static::pageheap_lock();
                                    SpinLockHolder::SpinLockHolder(&local_6d0,pSVar3);
                                    pPVar4 = tcmalloc::Static::pageheap();
                                    tcmalloc::PageHeap::StatsLocked((Stats *)&l_11,pPVar4);
                                    *value = local_6d8;
                                    this_local._7_1_ = true;
                                    SpinLockHolder::~SpinLockHolder(&local_6d0);
                                  }
                                  else {
                                    iVar2 = strcmp(name,"tcmalloc.max_total_thread_cache_bytes");
                                    if (iVar2 == 0) {
                                      pSVar3 = tcmalloc::Static::pageheap_lock();
                                      SpinLockHolder::SpinLockHolder
                                                ((SpinLockHolder *)
                                                 &stats_7.pageheap.total_reserve_bytes,pSVar3);
                                      sVar5 = tcmalloc::ThreadCache::overall_thread_cache_size();
                                      *value = sVar5;
                                      this_local._7_1_ = true;
                                      SpinLockHolder::~SpinLockHolder
                                                ((SpinLockHolder *)
                                                 &stats_7.pageheap.total_reserve_bytes);
                                    }
                                    else {
                                      iVar2 = strcmp(name,"tcmalloc.min_per_thread_cache_bytes");
                                      if (iVar2 == 0) {
                                        sVar5 = tcmalloc::ThreadCache::min_per_thread_cache_size();
                                        *value = sVar5;
                                        this_local._7_1_ = true;
                                      }
                                      else {
                                        iVar2 = strcmp(name,
                                                  "tcmalloc.current_total_thread_cache_bytes");
                                        if (iVar2 == 0) {
                                          TCMallocStats::TCMallocStats((TCMallocStats *)&l_12);
                                          ExtractStats((TCMallocStats *)&l_12,(uint64_t *)0x0,
                                                       (SmallSpanStats *)0x0,(LargeSpanStats *)0x0);
                                          *value = (size_t)l_12.lock_;
                                          this_local._7_1_ = true;
                                        }
                                        else {
                                          iVar2 = strcmp(name,"tcmalloc.aggressive_memory_decommit")
                                          ;
                                          if (iVar2 == 0) {
                                            pSVar3 = tcmalloc::Static::pageheap_lock();
                                            SpinLockHolder::SpinLockHolder(&l_13,pSVar3);
                                            pPVar4 = tcmalloc::Static::pageheap();
                                            bVar1 = tcmalloc::PageHeap::GetAggressiveDecommit
                                                              (pPVar4);
                                            *value = (ulong)bVar1;
                                            this_local._7_1_ = true;
                                            SpinLockHolder::~SpinLockHolder(&l_13);
                                          }
                                          else {
                                            iVar2 = strcmp(name,"tcmalloc.heap_limit_mb");
                                            if (iVar2 == 0) {
                                              pSVar3 = tcmalloc::Static::pageheap_lock();
                                              SpinLockHolder::SpinLockHolder(&h,pSVar3);
                                              *value = 
                                                  FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead
                                                  ::FLAGS_tcmalloc_heap_limit_mb;
                                              this_local._7_1_ = true;
                                              SpinLockHolder::~SpinLockHolder(&h);
                                            }
                                            else {
                                              iVar2 = strcmp(name,"tcmalloc.impl.thread_cache_count"
                                                            );
                                              if (iVar2 == 0) {
                                                pSVar3 = tcmalloc::Static::pageheap_lock();
                                                SpinLockHolder::SpinLockHolder
                                                          ((SpinLockHolder *)&portal,pSVar3);
                                                iVar2 = tcmalloc::ThreadCache::thread_heap_count();
                                                *value = (long)iVar2;
                                                this_local._7_1_ = true;
                                                SpinLockHolder::~SpinLockHolder
                                                          ((SpinLockHolder *)&portal);
                                              }
                                              else {
                                                iVar2 = strcmp(name,"tcmalloc.sample_parameter");
                                                if (iVar2 == 0) {
                                                  *value = 
                                                  FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead
                                                  ::FLAGS_tcmalloc_sample_parameter;
                                                  this_local._7_1_ = true;
                                                }
                                                else {
                                                  ppTVar6 = tcmalloc::TestingPortal::CheckGetPortal
                                                                      (name,value);
                                                  if (ppTVar6 == (TestingPortal **)0x0) {
                                                    this_local._7_1_ = false;
                                                  }
                                                  else {
                                                    pTVar7 = &tcmalloc::TestingPortalImpl::Get()->
                                                              super_TestingPortal;
                                                    *ppTVar6 = pTVar7;
                                                    *value = 1;
                                                    this_local._7_1_ = true;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

virtual bool GetNumericProperty(const char* name, size_t* value) {
    ASSERT(name != nullptr);

    if (strcmp(name, "generic.current_allocated_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.pageheap.system_bytes
               - stats.thread_bytes
               - stats.central_bytes
               - stats.transfer_bytes
               - stats.pageheap.free_bytes
               - stats.pageheap.unmapped_bytes;
      return true;
    }

    if (strcmp(name, "generic.heap_size") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.pageheap.system_bytes;
      return true;
    }

    if (strcmp(name, "generic.total_physical_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.pageheap.system_bytes + stats.metadata_bytes -
               stats.pageheap.unmapped_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.slack_bytes") == 0) {
      // Kept for backwards compatibility.  Now defined externally as:
      //    pageheap_free_bytes + pageheap_unmapped_bytes.
      SpinLockHolder l(Static::pageheap_lock());
      PageHeap::Stats stats = Static::pageheap()->StatsLocked();
      *value = stats.free_bytes + stats.unmapped_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.central_cache_free_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.central_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.transfer_cache_free_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.transfer_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.thread_cache_free_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.thread_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_free_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().free_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_unmapped_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().unmapped_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_committed_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().committed_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_scavenge_count") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().scavenge_count;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_commit_count") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().commit_count;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_total_commit_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().total_commit_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_decommit_count") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().decommit_count;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_total_decommit_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().total_decommit_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_reserve_count") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().reserve_count;
      return true;
    }

    if (strcmp(name, "tcmalloc.pageheap_total_reserve_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = Static::pageheap()->StatsLocked().total_reserve_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.max_total_thread_cache_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = ThreadCache::overall_thread_cache_size();
      return true;
    }

    if (strcmp(name, "tcmalloc.min_per_thread_cache_bytes") == 0) {
      *value = ThreadCache::min_per_thread_cache_size();
      return true;
    }

    if (strcmp(name, "tcmalloc.current_total_thread_cache_bytes") == 0) {
      TCMallocStats stats;
      ExtractStats(&stats, nullptr, nullptr, nullptr);
      *value = stats.thread_bytes;
      return true;
    }

    if (strcmp(name, "tcmalloc.aggressive_memory_decommit") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = size_t(Static::pageheap()->GetAggressiveDecommit());
      return true;
    }

    if (strcmp(name, "tcmalloc.heap_limit_mb") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      *value = FLAGS_tcmalloc_heap_limit_mb;
      return true;
    }

    if (strcmp(name, "tcmalloc.impl.thread_cache_count") == 0) {
      SpinLockHolder h(Static::pageheap_lock());
      *value = ThreadCache::thread_heap_count();
      return true;
    }

    if (strcmp(name, "tcmalloc.sample_parameter") == 0) {
      *value = FLAGS_tcmalloc_sample_parameter;
      return true;
    }

    if (TestingPortal** portal = TestingPortal::CheckGetPortal(name, value); portal) {
      *portal = TestingPortalImpl::Get();
      *value = 1;
      return true;
    }

    return false;
  }